

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O1

void CPU::WDC65816::ProcessorStorageConstructor::absolute_rmw
               (AccessType param_1,bool is8bit,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  undefined8 in_RAX;
  undefined1 auStack_18 [6];
  undefined2 local_12;
  
  local_12 = (undefined2)((ulong)in_RAX >> 0x30);
  auStack_18 = (undefined1  [6])CONCAT15(0,(int5)in_RAX);
  if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*target->_M_invoker)((_Any_data *)target,auStack_18 + 5);
    _auStack_18 = (uint7)(uint6)auStack_18;
    if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*target->_M_invoker)((_Any_data *)target,(MicroOp *)&local_12);
      _auStack_18 = CONCAT17(0x1a,_auStack_18);
      if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*target->_M_invoker)((_Any_data *)target,(MicroOp *)((long)&local_12 + 1));
        read_modify_write(is8bit,target);
        return;
      }
    }
  }
  std::__throw_bad_function_call();
}

Assistant:

static void absolute_rmw(AccessType, bool is8bit, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);			// AAL.
		target(CycleFetchIncrementPC);			// AAH.
		target(OperationConstructAbsolute);		// Calculate data address.

		read_modify_write(is8bit, target);
	}